

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O3

SquareMatrix<std::complex<double>_> __thiscall
qclab::qgates::RotationX<std::complex<double>_>::matrix(RotationX<std::complex<double>_> *this)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  data_type extraout_RDX;
  long in_RSI;
  SquareMatrix<std::complex<double>_> SVar4;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x10);
  uVar2 = *(ulong *)(in_RSI + 0x18);
  (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)0x2;
  puVar3 = (undefined8 *)operator_new__(0x40);
  *(undefined8 **)
   &(this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.qubit_ =
       puVar3;
  *puVar3 = uVar1;
  puVar3[1] = 0;
  puVar3[2] = 0;
  uVar2 = uVar2 ^ 0x8000000000000000;
  puVar3[3] = uVar2;
  puVar3[4] = 0;
  puVar3[5] = uVar2;
  puVar3[6] = uVar1;
  puVar3[7] = 0;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using SqMat = qclab::dense::SquareMatrix< T > ;
          return SqMat(      this->cos()  , T(0,-this->sin()) ,
                        T(0,-this->sin()) ,      this->cos()  ) ;
        }